

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O3

int read_data_compressed(archive_read *a,void **buff,size_t *size,int64_t *offset,size_t looper)

{
  CPpmd7 *p;
  IPpmd7_RangeDec *rc;
  void *pvVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  rar_filter *prVar8;
  void *pvVar9;
  undefined4 extraout_var;
  void *pvVar10;
  uLong uVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  char *fmt;
  uint uVar16;
  ulong uVar17;
  ulong uVar18;
  uint32_t uVar19;
  uint uVar20;
  uchar *puVar21;
  rar_filter *filter;
  uint32_t uVar22;
  uint uVar23;
  int64_t end;
  long local_60;
  ulong local_58;
  size_t local_50;
  rar_br *local_48;
  ulong local_40;
  ssize_t *local_38;
  
  iVar4 = -0x1e;
  if (looper < 0x401) {
    pvVar1 = a->format->data;
    if (*(char *)((long)pvVar1 + 0xd0) != '\0') {
      local_50 = looper + 1;
      local_48 = (rar_br *)((long)pvVar1 + 0x4f30);
      local_38 = (ssize_t *)((long)pvVar1 + 0x4f40);
      p = (CPpmd7 *)((long)pvVar1 + 0x3d8);
      rc = (IPpmd7_RangeDec *)((long)pvVar1 + 0x4ec8);
      uVar12 = 0;
      do {
        sVar2 = *(size_t *)((long)pvVar1 + 0x3c8);
        if (sVar2 != 0) {
          uVar7 = *(uint *)((long)pvVar1 + 0xd4);
          if ((ulong)uVar7 == 0) {
            pvVar9 = *(void **)((long)pvVar1 + 0x3c0);
            *buff = pvVar9;
            *size = sVar2;
            *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + sVar2;
            lVar15 = *(long *)((long)pvVar1 + 0xc0);
            *offset = lVar15;
            *(size_t *)((long)pvVar1 + 0xc0) = lVar15 + *size;
            *(long *)((long)pvVar1 + 0x3c8) = *(long *)((long)pvVar1 + 0x3c8) - *size;
            *(size_t *)((long)pvVar1 + 0x3c0) = (long)pvVar9 + *size;
            puVar21 = (uchar *)*buff;
          }
          else {
            puVar21 = *(uchar **)((long)pvVar1 + 0xe0);
            *buff = puVar21;
            *size = (ulong)uVar7;
            *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
LAB_00150ffc:
            lVar15 = *(long *)((long)pvVar1 + 0xc0);
            *offset = lVar15;
            *(size_t *)((long)pvVar1 + 0xc0) = lVar15 + *size;
          }
          uVar11 = cm_zlib_crc32(*(unsigned_long *)((long)pvVar1 + 0xf0),puVar21,(uInt)*size);
          *(uLong *)((long)pvVar1 + 0xf0) = uVar11;
          goto LAB_001510e0;
        }
        if (*(char *)((long)pvVar1 + 0x3d1) != '\0') {
LAB_00150f1b:
          uVar7 = *(uint *)((long)pvVar1 + 0xd4);
          if ((ulong)uVar7 != 0) {
            puVar21 = *(uchar **)((long)pvVar1 + 0xe0);
            *buff = puVar21;
            *size = (ulong)uVar7;
            lVar15 = *(long *)((long)pvVar1 + 0xc0);
            *offset = lVar15;
            *(size_t *)((long)pvVar1 + 0xc0) = lVar15 + *size;
            uVar11 = cm_zlib_crc32(*(unsigned_long *)((long)pvVar1 + 0xf0),puVar21,(uInt)*size);
            *(uLong *)((long)pvVar1 + 0xf0) = uVar11;
            *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
LAB_00150f6e:
            uVar12 = 0;
            goto LAB_001510e0;
          }
          *buff = (void *)0x0;
          *size = 0;
          *offset = *(int64_t *)((long)pvVar1 + 0xb8);
          if (*(long *)((long)pvVar1 + 8) == *(long *)((long)pvVar1 + 0xf0)) {
            *(undefined1 *)((long)pvVar1 + 0xed) = 1;
            uVar12 = 1;
            goto LAB_001510e0;
          }
          fmt = "File CRC error";
LAB_001510cc:
          archive_set_error(&a->archive,0x54,fmt);
          break;
        }
        if (*(int *)((long)pvVar1 + 0xe8) == 0) {
LAB_001508e9:
          if (*(long *)((long)pvVar1 + 0x3b8) == *(long *)((long)pvVar1 + 0x3a8)) {
            pvVar9 = a->format->data;
            filter = *(rar_filter **)((long)pvVar9 + 0x3a0);
            if (filter == (rar_filter *)0x0) break;
            lVar15 = *(long *)((long)pvVar9 + 0x3a8);
            local_58 = (ulong)filter->blocklength + lVar15;
            *(undefined8 *)((long)pvVar9 + 0x3a8) = 0x7fffffffffffffff;
            local_40 = uVar12;
            iVar4 = expand(a,(int64_t *)&local_58);
            uVar12 = local_58;
            if (iVar4 != 0) break;
            prVar8 = *(rar_filter **)((long)pvVar9 + 0x3a0);
            while( true ) {
              if (prVar8 == (rar_filter *)0x0) goto LAB_001510db;
              if (prVar8 == filter) break;
              prVar8 = prVar8->next;
            }
            if (((long)local_58 < 0) ||
               (uVar7 = filter->blocklength, local_58 != lVar15 + (ulong)uVar7)) break;
            pvVar10 = *(void **)((long)pvVar9 + 0x390);
            if (pvVar10 == (void *)0x0) {
              pvVar10 = calloc(1,0x40024);
              *(void **)((long)pvVar9 + 0x390) = pvVar10;
              if (pvVar10 == (void *)0x0) break;
            }
            iVar4 = copy_from_lzss_window(a,(void *)((long)pvVar10 + 0x20),lVar15,uVar7);
            if ((iVar4 != 0) ||
               (iVar4 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar9 + 0x390),
                                       *(size_t *)((long)pvVar9 + 0xb8)), iVar4 == 0)) break;
            uVar19 = filter->filteredblockaddress;
            uVar22 = filter->filteredblocklength;
            *(rar_filter **)((long)pvVar9 + 0x3a0) = filter->next;
            filter->next = (rar_filter *)0x0;
            while( true ) {
              delete_filter(filter);
              filter = *(rar_filter **)((long)pvVar9 + 0x3a0);
              if (filter == (rar_filter *)0x0) break;
              uVar18 = filter->blockstartpos;
              if ((uVar18 != *(ulong *)((long)pvVar9 + 0x3a8)) || (filter->blocklength != uVar22)) {
                if (uVar18 < uVar12) goto LAB_001510db;
                *(ulong *)((long)pvVar9 + 0x3a8) = uVar18;
                break;
              }
              memmove((void *)(*(long *)((long)pvVar9 + 0x390) + 0x20),
                      (void *)(*(long *)((long)pvVar9 + 0x390) + (ulong)uVar19 + 0x20),(ulong)uVar22
                     );
              iVar4 = execute_filter(a,filter,*(rar_virtual_machine **)((long)pvVar9 + 0x390),
                                     *(size_t *)((long)pvVar9 + 0xb8));
              if (iVar4 == 0) goto LAB_001510db;
              uVar19 = filter->filteredblockaddress;
              uVar22 = filter->filteredblocklength;
              *(rar_filter **)((long)pvVar9 + 0x3a0) = filter->next;
              filter->next = (rar_filter *)0x0;
            }
            *(ulong *)((long)pvVar9 + 0x3b8) = uVar12;
            *(ulong *)((long)pvVar9 + 0x3c0) =
                 *(long *)((long)pvVar9 + 0x390) + (ulong)uVar19 + 0x20;
            *(ulong *)((long)pvVar9 + 0x3c8) = (ulong)uVar22;
            uVar12 = local_40;
          }
          else {
            if ((*(long *)((long)pvVar1 + 0x4f48) == 0) &&
               (uVar12 = 0, 0 < *(long *)((long)a->format->data + 0xa8))) {
              pvVar9 = rar_read_ahead(a,1,local_38);
              *(void **)((long)pvVar1 + 0x4f48) = pvVar9;
              if (pvVar9 == (void *)0x0) {
                fmt = "Truncated RAR file data";
                goto LAB_001510cc;
              }
              if (*(int *)((long)pvVar1 + 0x4f38) == 0) {
                rar_br_fillup(a,local_48);
              }
              uVar12 = 0;
            }
            if (*(char *)((long)pvVar1 + 0x388) != '\0') {
              iVar4 = parse_codes(a);
              uVar12 = CONCAT44(extraout_var,iVar4);
              if (iVar4 < -0x14) goto LAB_001510e0;
            }
            if (*(char *)((long)pvVar1 + 0x3d2) == '\0') {
              lVar15 = *(long *)((long)pvVar1 + 0xb8);
              local_60 = (ulong)*(uint *)((long)pvVar1 + 0xe8) + lVar15;
              if (*(long *)((long)pvVar1 + 0x3a8) < local_60) {
                local_60 = *(long *)((long)pvVar1 + 0x3a8);
              }
              uVar7 = expand(a,&local_60);
              uVar12 = (ulong)uVar7;
              if (uVar7 != 0) goto LAB_001510e0;
              uVar12 = local_60 - lVar15;
              *(ulong *)((long)pvVar1 + 0xb0) = uVar12;
              *(long *)((long)pvVar1 + 0x3b8) = local_60;
              if (uVar12 == 0 && local_60 != *(long *)((long)pvVar1 + 0x3a8)) {
                fmt = "Internal error extracting RAR file";
                goto LAB_001510cc;
              }
            }
            else {
              iVar4 = Ppmd7_DecodeSymbol(p,rc);
              if (iVar4 < 0) {
LAB_00150fa2:
                fmt = "Invalid symbol";
                goto LAB_001510cc;
              }
              if (iVar4 == *(int *)((long)pvVar1 + 0x3d4)) {
                iVar5 = Ppmd7_DecodeSymbol(p,rc);
                if (iVar5 < 0) goto LAB_00150fa2;
                switch(iVar5) {
                case 0:
                  *(undefined1 *)((long)pvVar1 + 0x388) = 1;
                  uVar7 = read_data_compressed(a,buff,size,offset,local_50);
                  uVar12 = (ulong)uVar7;
                  goto LAB_001510e0;
                default:
                  goto switchD_00150a4f_caseD_1;
                case 2:
                  *(undefined1 *)((long)pvVar1 + 0x3d1) = 1;
                  goto LAB_00150efc;
                case 3:
                  archive_set_error(&a->archive,-1,"Parsing filters is unsupported.");
                  uVar12 = 0xffffffe7;
                  goto LAB_001510e0;
                case 4:
                  uVar7 = 0;
                  iVar4 = 0x10;
                  do {
                    iVar5 = Ppmd7_DecodeSymbol(p,rc);
                    if (iVar5 < 0) goto LAB_00150fa2;
                    uVar7 = uVar7 | iVar5 << ((byte)iVar4 & 0x1f);
                    iVar4 = iVar4 + -8;
                  } while (iVar4 != -8);
                  iVar4 = Ppmd7_DecodeSymbol(p,rc);
                  if (iVar4 < 0) goto LAB_00150fa2;
                  uVar20 = iVar4 + 0x20;
                  uVar13 = *(uint *)((long)pvVar1 + 0x358);
                  uVar6 = *(uint *)((long)pvVar1 + 0x360) & uVar13;
                  uVar23 = (uVar6 - uVar7) - 2 & uVar13;
                  uVar7 = uVar20;
                  do {
                    uVar14 = uVar23;
                    if ((int)uVar23 < (int)uVar6) {
                      uVar14 = uVar6;
                    }
                    uVar14 = (uVar13 - uVar14) + 1;
                    if ((int)uVar7 < (int)uVar14) {
                      uVar14 = uVar7;
                    }
                    pvVar10 = (void *)((long)(int)uVar6 + *(long *)((long)pvVar1 + 0x350));
                    pvVar9 = (void *)(*(long *)((long)pvVar1 + 0x350) + (long)(int)uVar23);
                    if (((int)(uVar14 + uVar6) < (int)uVar23) ||
                       ((int)(uVar14 + uVar23) < (int)uVar6)) {
                      memcpy(pvVar10,pvVar9,(long)(int)uVar14);
                    }
                    else if (0 < (int)uVar14) {
                      uVar12 = 0;
                      do {
                        *(undefined1 *)((long)pvVar10 + uVar12) =
                             *(undefined1 *)((long)pvVar9 + uVar12);
                        uVar12 = uVar12 + 1;
                      } while (uVar14 != uVar12);
                    }
                    uVar13 = *(uint *)((long)pvVar1 + 0x358);
                    uVar6 = uVar14 + uVar6 & uVar13;
                    uVar23 = uVar14 + uVar23 & uVar13;
                    uVar16 = uVar7 - uVar14;
                    bVar3 = (int)uVar14 <= (int)uVar7;
                    uVar7 = uVar16;
                  } while (uVar16 != 0 && bVar3);
                  break;
                case 5:
                  iVar4 = Ppmd7_DecodeSymbol(p,rc);
                  if (iVar4 < 0) goto LAB_00150fa2;
                  uVar20 = iVar4 + 4;
                  uVar7 = *(uint *)((long)pvVar1 + 0x358);
                  uVar6 = *(uint *)((long)pvVar1 + 0x360) & uVar7;
                  uVar23 = uVar6 - 1 & uVar7;
                  uVar13 = uVar20;
                  do {
                    uVar14 = uVar23;
                    if ((int)uVar23 < (int)uVar6) {
                      uVar14 = uVar6;
                    }
                    uVar14 = (uVar7 - uVar14) + 1;
                    if ((int)uVar13 < (int)uVar14) {
                      uVar14 = uVar13;
                    }
                    pvVar10 = (void *)((long)(int)uVar6 + *(long *)((long)pvVar1 + 0x350));
                    pvVar9 = (void *)(*(long *)((long)pvVar1 + 0x350) + (long)(int)uVar23);
                    if (((int)(uVar14 + uVar6) < (int)uVar23) ||
                       ((int)(uVar14 + uVar23) < (int)uVar6)) {
                      memcpy(pvVar10,pvVar9,(long)(int)uVar14);
                    }
                    else if (0 < (int)uVar14) {
                      uVar12 = 0;
                      do {
                        *(undefined1 *)((long)pvVar10 + uVar12) =
                             *(undefined1 *)((long)pvVar9 + uVar12);
                        uVar12 = uVar12 + 1;
                      } while (uVar14 != uVar12);
                    }
                    uVar7 = *(uint *)((long)pvVar1 + 0x358);
                    uVar6 = uVar14 + uVar6 & uVar7;
                    uVar23 = uVar14 + uVar23 & uVar7;
                    uVar16 = uVar13 - uVar14;
                    bVar3 = (int)uVar14 <= (int)uVar13;
                    uVar13 = uVar16;
                  } while (uVar16 != 0 && bVar3);
                }
                uVar12 = (ulong)uVar20;
                lVar15 = *(long *)((long)pvVar1 + 0x360) + uVar12;
              }
              else {
switchD_00150a4f_caseD_1:
                *(char *)(*(long *)((long)pvVar1 + 0x350) +
                         (long)(int)(*(uint *)((long)pvVar1 + 0x358) &
                                    *(uint *)((long)pvVar1 + 0x360))) = (char)iVar4;
                lVar15 = *(long *)((long)pvVar1 + 0x360) + 1;
                uVar12 = 1;
              }
              *(long *)((long)pvVar1 + 0x360) = lVar15;
              uVar12 = uVar12 + *(long *)((long)pvVar1 + 0xb0);
              *(ulong *)((long)pvVar1 + 0xb0) = uVar12;
            }
            uVar18 = (ulong)(uint)(*(int *)((long)pvVar1 + 0xd8) - *(int *)((long)pvVar1 + 0xd4));
            if ((long)uVar12 < (long)uVar18) {
              uVar18 = uVar12;
            }
            uVar7 = copy_from_lzss_window_to_unp
                              (a,buff,*(int64_t *)((long)pvVar1 + 0xb8),(int)uVar18);
            uVar12 = (ulong)uVar7;
            if (uVar7 != 0) goto LAB_001510e0;
            *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + uVar18;
            *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) - uVar18;
            uVar12 = 0;
          }
LAB_00150efc:
          puVar21 = (uchar *)*buff;
          if (puVar21 != (uchar *)0x0) {
            *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
            *size = (ulong)*(uint *)((long)pvVar1 + 0xd8);
            goto LAB_00150ffc;
          }
        }
        else {
          if (*(long *)((long)pvVar1 + 0x28) <= *(long *)((long)pvVar1 + 0xb8)) goto LAB_00150f1b;
          if ((*(char *)((long)pvVar1 + 0x3d2) != '\0') ||
             (uVar18 = *(ulong *)((long)pvVar1 + 0xb0), (long)uVar18 < 1)) goto LAB_001508e9;
          uVar17 = (ulong)(uint)(*(int *)((long)pvVar1 + 0xd8) - *(int *)((long)pvVar1 + 0xd4));
          if (uVar18 < uVar17) {
            uVar17 = uVar18;
          }
          uVar7 = copy_from_lzss_window_to_unp(a,buff,*(long *)((long)pvVar1 + 0xb8),(int)uVar17);
          uVar12 = (ulong)uVar7;
          if (uVar7 != 0) goto LAB_001510e0;
          *(long *)((long)pvVar1 + 0xb8) = *(long *)((long)pvVar1 + 0xb8) + uVar17;
          *(long *)((long)pvVar1 + 0xb0) = *(long *)((long)pvVar1 + 0xb0) - uVar17;
          puVar21 = (uchar *)*buff;
          uVar12 = 0;
          if (puVar21 != (uchar *)0x0) {
            *(undefined4 *)((long)pvVar1 + 0xd4) = 0;
            *size = (ulong)*(uint *)((long)pvVar1 + 0xd8);
            lVar15 = *(long *)((long)pvVar1 + 0xc0);
            *offset = lVar15;
            *(size_t *)((long)pvVar1 + 0xc0) = lVar15 + *size;
            uVar11 = cm_zlib_crc32(*(unsigned_long *)((long)pvVar1 + 0xf0),puVar21,(uInt)*size);
            *(uLong *)((long)pvVar1 + 0xf0) = uVar11;
            goto LAB_00150f6e;
          }
        }
      } while (*(char *)((long)pvVar1 + 0xd0) != '\0');
    }
LAB_001510db:
    uVar12 = 0xffffffe2;
LAB_001510e0:
    iVar4 = (int)uVar12;
  }
  return iVar4;
}

Assistant:

static int
read_data_compressed(struct archive_read *a, const void **buff, size_t *size,
                     int64_t *offset, size_t looper)
{
  if (looper++ > MAX_COMPRESS_DEPTH)
    return (ARCHIVE_FATAL);

  struct rar *rar;
  int64_t start, end;
  size_t bs;
  int ret = (ARCHIVE_OK), sym, code, lzss_offset, length, i;

  rar = (struct rar *)(a->format->data);

  do {
    if (!rar->valid)
      return (ARCHIVE_FATAL);

    if (rar->filters.bytes_ready > 0)
    {
      /* Flush unp_buffer first */
      if (rar->unp_offset > 0)
      {
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        rar->unp_offset = 0;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
      }
      else
      {
        *buff = rar->filters.bytes;
        *size = rar->filters.bytes_ready;

        rar->offset += *size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;

        rar->filters.bytes_ready -= *size;
        rar->filters.bytes += *size;
      }
      goto ending_block;
    }

    if (rar->ppmd_eod ||
       (rar->dictionary_size && rar->offset >= rar->unp_size))
    {
      if (rar->unp_offset > 0) {
        /*
         * We have unprocessed extracted data. write it out.
         */
        *buff = rar->unp_buffer;
        *size = rar->unp_offset;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        rar->unp_offset = 0;
        return (ARCHIVE_OK);
      }
      *buff = NULL;
      *size = 0;
      *offset = rar->offset;
      if (rar->file_crc != rar->crc_calculated) {
#ifndef DONT_FAIL_ON_CRC_ERROR
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "File CRC error");
        return (ARCHIVE_FATAL);
#endif
      }
      rar->entry_eof = 1;
      return (ARCHIVE_EOF);
    }

    if (!rar->is_ppmd_block && rar->dictionary_size && rar->bytes_uncopied > 0)
    {
      if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
        bs = rar->unp_buffer_size - rar->unp_offset;
      else
        bs = (size_t)rar->bytes_uncopied;
      ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, (int)bs);
      if (ret != ARCHIVE_OK)
        return (ret);
      rar->offset += bs;
      rar->bytes_uncopied -= bs;
      if (*buff != NULL) {
        rar->unp_offset = 0;
        *size = rar->unp_buffer_size;
        *offset = rar->offset_outgoing;
        rar->offset_outgoing += *size;
        /* Calculate File CRC. */
        rar->crc_calculated = crc32(rar->crc_calculated, *buff,
          (unsigned)*size);
        return (ret);
      }
      continue;
    }

    if (rar->filters.lastend == rar->filters.filterstart)
    {
      if (!run_filters(a))
        return (ARCHIVE_FATAL);
      continue;
    }

    if (!rar->br.next_in &&
      (ret = rar_br_preparation(a, &(rar->br))) < ARCHIVE_WARN)
      return (ret);
    if (rar->start_new_table && ((ret = parse_codes(a)) < (ARCHIVE_WARN)))
      return (ret);

    if (rar->is_ppmd_block)
    {
      if ((sym = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
        &rar->ppmd7_context, &rar->range_dec.p)) < 0)
      {
        archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                          "Invalid symbol");
        return (ARCHIVE_FATAL);
      }
      if(sym != rar->ppmd_escape)
      {
        lzss_emit_literal(rar, sym);
        rar->bytes_uncopied++;
      }
      else
      {
        if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
          &rar->ppmd7_context, &rar->range_dec.p)) < 0)
        {
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Invalid symbol");
          return (ARCHIVE_FATAL);
        }

        switch(code)
        {
          case 0:
            rar->start_new_table = 1;
            return read_data_compressed(a, buff, size, offset, looper);

          case 2:
            rar->ppmd_eod = 1;/* End Of ppmd Data. */
            continue;

          case 3:
            archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
                              "Parsing filters is unsupported.");
            return (ARCHIVE_FAILED);

          case 4:
            lzss_offset = 0;
            for (i = 2; i >= 0; i--)
            {
              if ((code = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
                &rar->ppmd7_context, &rar->range_dec.p)) < 0)
              {
                archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                  "Invalid symbol");
                return (ARCHIVE_FATAL);
              }
              lzss_offset |= code << (i * 8);
            }
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, lzss_offset + 2, length + 32);
            rar->bytes_uncopied += length + 32;
            break;

          case 5:
            if ((length = __archive_ppmd7_functions.Ppmd7_DecodeSymbol(
              &rar->ppmd7_context, &rar->range_dec.p)) < 0)
            {
              archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                                "Invalid symbol");
              return (ARCHIVE_FATAL);
            }
            lzss_emit_match(rar, 1, length + 4);
            rar->bytes_uncopied += length + 4;
            break;

         default:
           lzss_emit_literal(rar, sym);
           rar->bytes_uncopied++;
        }
      }
    }
    else
    {
      start = rar->offset;
      end = start + rar->dictionary_size;
      if (rar->filters.filterstart < end) {
        end = rar->filters.filterstart;
      }

      ret = expand(a, &end);
      if (ret != ARCHIVE_OK)
	      return (ret);

      rar->bytes_uncopied = end - start;
      rar->filters.lastend = end;
      if (rar->filters.lastend != rar->filters.filterstart && rar->bytes_uncopied == 0) {
          /* Broken RAR files cause this case.
          * NOTE: If this case were possible on a normal RAR file
          * we would find out where it was actually bad and
          * what we would do to solve it. */
          archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
                            "Internal error extracting RAR file");
          return (ARCHIVE_FATAL);
      }
    }
    if (rar->bytes_uncopied > (rar->unp_buffer_size - rar->unp_offset))
      bs = rar->unp_buffer_size - rar->unp_offset;
    else
      bs = (size_t)rar->bytes_uncopied;
    ret = copy_from_lzss_window_to_unp(a, buff, rar->offset, (int)bs);
    if (ret != ARCHIVE_OK)
      return (ret);
    rar->offset += bs;
    rar->bytes_uncopied -= bs;
    /*
     * If *buff is NULL, it means unp_buffer is not full.
     * So we have to continue extracting a RAR file.
     */
  } while (*buff == NULL);

  rar->unp_offset = 0;
  *size = rar->unp_buffer_size;
  *offset = rar->offset_outgoing;
  rar->offset_outgoing += *size;
ending_block:
  /* Calculate File CRC. */
  rar->crc_calculated = crc32(rar->crc_calculated, *buff, (unsigned)*size);
  return ret;
}